

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O0

void dofindgem(void)

{
  int otyp;
  long lVar1;
  long lVar2;
  
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    pline("You spot a gem in the sparkling waters!");
  }
  else {
    pline("You feel a gem here!");
  }
  otyp = rnd_class(0x1f0,0x20e);
  mksobj_at(otyp,level,(int)u.ux,(int)u.uy,'\0','\0');
  lVar1 = (long)u.ux;
  lVar2 = (long)u.uy;
  *(uint *)&level->locations[lVar1][lVar2].field_0x6 =
       *(uint *)&level->locations[lVar1][lVar2].field_0x6 & 0xfffffe0f |
       (*(uint *)&level->locations[lVar1][lVar2].field_0x6 >> 4 & 0x1f | 1) << 4;
  newsym((int)u.ux,(int)u.uy);
  exercise(2,'\x01');
  return;
}

Assistant:

static void dofindgem(void) /* Find a gem in the sparkling waters. */
{
	if (!Blind) pline("You spot a gem in the sparkling waters!");
	else pline("You feel a gem here!");
	mksobj_at(rnd_class(DILITHIUM_CRYSTAL, LUCKSTONE-1), level,
			 u.ux, u.uy, FALSE, FALSE);
	SET_FOUNTAIN_LOOTED(u.ux,u.uy);
	newsym(u.ux, u.uy);
	exercise(A_WIS, TRUE);			/* a discovery! */
}